

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<LookupLhsIdentifier,_true,_true,_false,_false>::
visit<slang::ast::SimpleAssignmentPatternExpression>
          (ASTVisitor<LookupLhsIdentifier,_true,_true,_false,_false> *this,
          SimpleAssignmentPatternExpression *t)

{
  bool bVar1;
  
  bVar1 = Expression::bad((Expression *)t);
  if (bVar1) {
    return;
  }
  AssignmentPatternExpressionBase::visitExprs<LookupLhsIdentifier&>
            (&t->super_AssignmentPatternExpressionBase,(LookupLhsIdentifier *)this);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }